

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

GLFWbool parseMapping(_GLFWmapping *mapping,char *string)

{
  char *pcVar1;
  int iVar2;
  char *__s1;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  char *in_RSI;
  void *in_RDI;
  unsigned_long bit;
  unsigned_long hat;
  int8_t maximum;
  int8_t minimum;
  _GLFWmapelement *e;
  anon_struct_16_2_6ab6935c fields [22];
  size_t length;
  size_t i;
  char *c;
  bool local_1a2;
  char local_1a1;
  char *local_198;
  long local_190;
  char *local_188;
  long local_180;
  char *local_178;
  long local_170;
  char *local_168;
  long local_160;
  char *local_158;
  long local_150;
  char *local_148;
  long local_140;
  char *local_138;
  long local_130;
  char *local_128;
  long local_120;
  char *local_118;
  long local_110;
  char *local_108;
  long local_100;
  char *local_f8;
  long local_f0;
  char *local_e8;
  long local_e0;
  char *local_d8;
  long local_d0;
  char *local_c8;
  long local_c0;
  char *local_b8;
  long local_b0;
  char *local_a8;
  long local_a0;
  char *local_98;
  long local_90;
  char *local_88;
  long local_80;
  char *local_78;
  long local_70;
  char *local_68;
  long local_60;
  char *local_58;
  long local_50;
  char *local_48;
  long local_40;
  size_t local_30;
  ulong local_28;
  char *local_20 [2];
  void *local_10;
  GLFWbool local_4;
  
  local_198 = "platform";
  local_190 = 0;
  local_188 = "a";
  local_180 = (long)in_RDI + 0xa1;
  local_178 = "b";
  local_170 = (long)in_RDI + 0xa5;
  local_168 = "x";
  local_160 = (long)in_RDI + 0xa9;
  local_158 = "y";
  local_150 = (long)in_RDI + 0xad;
  local_148 = "back";
  local_140 = (long)in_RDI + 0xb9;
  local_138 = "start";
  local_130 = (long)in_RDI + 0xbd;
  local_128 = "guide";
  local_120 = (long)in_RDI + 0xc1;
  local_118 = "leftshoulder";
  local_110 = (long)in_RDI + 0xb1;
  local_108 = "rightshoulder";
  local_100 = (long)in_RDI + 0xb5;
  local_f8 = "leftstick";
  local_f0 = (long)in_RDI + 0xc5;
  local_e8 = "rightstick";
  local_e0 = (long)in_RDI + 0xc9;
  local_d8 = "dpup";
  local_d0 = (long)in_RDI + 0xcd;
  local_c8 = "dpright";
  local_c0 = (long)in_RDI + 0xd1;
  local_b8 = "dpdown";
  local_b0 = (long)in_RDI + 0xd5;
  local_a8 = "dpleft";
  local_a0 = (long)in_RDI + 0xd9;
  local_98 = "lefttrigger";
  local_90 = (long)in_RDI + 0xed;
  local_88 = "righttrigger";
  local_80 = (long)in_RDI + 0xf1;
  local_78 = "leftx";
  local_70 = (long)in_RDI + 0xdd;
  local_68 = "lefty";
  local_60 = (long)in_RDI + 0xe1;
  local_58 = "rightx";
  local_50 = (long)in_RDI + 0xe5;
  local_48 = "righty";
  local_40 = (long)in_RDI + 0xe9;
  local_20[0] = in_RSI;
  local_10 = in_RDI;
  local_30 = strcspn(in_RSI,",");
  if ((local_30 == 0x20) && (local_20[0][0x20] == ',')) {
    memcpy((void *)((long)local_10 + 0x80),local_20[0],0x20);
    local_20[0] = local_20[0] + local_30 + 1;
    local_30 = strcspn(local_20[0],",");
    if ((local_30 < 0x80) && (local_20[0][local_30] == ',')) {
      memcpy(local_10,local_20[0],local_30);
      for (local_20[0] = local_20[0] + local_30 + 1; *local_20[0] != '\0';
          local_20[0] = local_20[0] + sVar5) {
        if ((*local_20[0] == '+') || (*local_20[0] == '-')) {
          return 0;
        }
        for (local_28 = 0; local_28 < 0x16; local_28 = local_28 + 1) {
          local_30 = strlen((&local_198)[local_28 * 2]);
          iVar2 = strncmp(local_20[0],(&local_198)[local_28 * 2],local_30);
          if ((iVar2 == 0) && (local_20[0][local_30] == ':')) {
            __s1 = local_20[0] + local_30 + 1;
            local_20[0] = __s1;
            if ((&local_190)[local_28 * 2] == 0) {
              local_30 = 5;
              iVar2 = strncmp(__s1,"Linux",5);
              if (iVar2 != 0) {
                return 0;
              }
              break;
            }
            pcVar1 = (char *)(&local_190)[local_28 * 2];
            local_1a1 = -1;
            local_1a2 = true;
            if (*__s1 == '+') {
              local_1a1 = '\0';
              local_20[0] = __s1 + 1;
            }
            else {
              if (*__s1 == '-') {
                local_20[0] = __s1 + 1;
              }
              local_1a2 = *__s1 != '-';
            }
            if (*local_20[0] == 'a') {
              *pcVar1 = '\x01';
            }
            else if (*local_20[0] == 'b') {
              *pcVar1 = '\x02';
            }
            else {
              if (*local_20[0] != 'h') break;
              *pcVar1 = '\x03';
            }
            if (*pcVar1 == '\x03') {
              uVar3 = strtoul(local_20[0] + 1,local_20,10);
              uVar4 = strtoul(local_20[0] + 1,local_20,10);
              pcVar1[1] = (byte)(uVar3 << 4) | (byte)uVar4;
            }
            else {
              uVar3 = strtoul(local_20[0] + 1,local_20,10);
              pcVar1[1] = (char)uVar3;
            }
            if (*pcVar1 == '\x01') {
              pcVar1[2] = (char)(2 / (long)((int)local_1a2 - (int)local_1a1));
              pcVar1[3] = -(local_1a2 + local_1a1);
              if (*local_20[0] == '~') {
                pcVar1[2] = -pcVar1[2];
                pcVar1[3] = -pcVar1[3];
              }
            }
            break;
          }
        }
        sVar5 = strcspn(local_20[0],",");
        local_20[0] = local_20[0] + sVar5;
        sVar5 = strspn(local_20[0],",");
      }
      for (local_28 = 0; local_28 < 0x20; local_28 = local_28 + 1) {
        if (('@' < *(char *)((long)local_10 + local_28 + 0x80)) &&
           (*(char *)((long)local_10 + local_28 + 0x80) < 'G')) {
          *(char *)((long)local_10 + local_28 + 0x80) =
               *(char *)((long)local_10 + local_28 + 0x80) + ' ';
        }
      }
      _glfwPlatformUpdateGamepadGUID((char *)((long)local_10 + 0x80));
      local_4 = 1;
    }
    else {
      _glfwInputError(0x10004,(char *)0x0);
      local_4 = 0;
    }
  }
  else {
    _glfwInputError(0x10004,(char *)0x0);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static GLFWbool parseMapping(_GLFWmapping* mapping, const char* string)
{
    const char* c = string;
    size_t i, length;
    struct
    {
        const char* name;
        _GLFWmapelement* element;
    } fields[] =
    {
        { "platform",      NULL },
        { "a",             mapping->buttons + GLFW_GAMEPAD_BUTTON_A },
        { "b",             mapping->buttons + GLFW_GAMEPAD_BUTTON_B },
        { "x",             mapping->buttons + GLFW_GAMEPAD_BUTTON_X },
        { "y",             mapping->buttons + GLFW_GAMEPAD_BUTTON_Y },
        { "back",          mapping->buttons + GLFW_GAMEPAD_BUTTON_BACK },
        { "start",         mapping->buttons + GLFW_GAMEPAD_BUTTON_START },
        { "guide",         mapping->buttons + GLFW_GAMEPAD_BUTTON_GUIDE },
        { "leftshoulder",  mapping->buttons + GLFW_GAMEPAD_BUTTON_LEFT_BUMPER },
        { "rightshoulder", mapping->buttons + GLFW_GAMEPAD_BUTTON_RIGHT_BUMPER },
        { "leftstick",     mapping->buttons + GLFW_GAMEPAD_BUTTON_LEFT_THUMB },
        { "rightstick",    mapping->buttons + GLFW_GAMEPAD_BUTTON_RIGHT_THUMB },
        { "dpup",          mapping->buttons + GLFW_GAMEPAD_BUTTON_DPAD_UP },
        { "dpright",       mapping->buttons + GLFW_GAMEPAD_BUTTON_DPAD_RIGHT },
        { "dpdown",        mapping->buttons + GLFW_GAMEPAD_BUTTON_DPAD_DOWN },
        { "dpleft",        mapping->buttons + GLFW_GAMEPAD_BUTTON_DPAD_LEFT },
        { "lefttrigger",   mapping->axes + GLFW_GAMEPAD_AXIS_LEFT_TRIGGER },
        { "righttrigger",  mapping->axes + GLFW_GAMEPAD_AXIS_RIGHT_TRIGGER },
        { "leftx",         mapping->axes + GLFW_GAMEPAD_AXIS_LEFT_X },
        { "lefty",         mapping->axes + GLFW_GAMEPAD_AXIS_LEFT_Y },
        { "rightx",        mapping->axes + GLFW_GAMEPAD_AXIS_RIGHT_X },
        { "righty",        mapping->axes + GLFW_GAMEPAD_AXIS_RIGHT_Y }
    };

    length = strcspn(c, ",");
    if (length != 32 || c[length] != ',')
    {
        _glfwInputError(GLFW_INVALID_VALUE, NULL);
        return GLFW_FALSE;
    }

    memcpy(mapping->guid, c, length);
    c += length + 1;

    length = strcspn(c, ",");
    if (length >= sizeof(mapping->name) || c[length] != ',')
    {
        _glfwInputError(GLFW_INVALID_VALUE, NULL);
        return GLFW_FALSE;
    }

    memcpy(mapping->name, c, length);
    c += length + 1;

    while (*c)
    {
        // TODO: Implement output modifiers
        if (*c == '+' || *c == '-')
            return GLFW_FALSE;

        for (i = 0;  i < sizeof(fields) / sizeof(fields[0]);  i++)
        {
            length = strlen(fields[i].name);
            if (strncmp(c, fields[i].name, length) != 0 || c[length] != ':')
                continue;

            c += length + 1;

            if (fields[i].element)
            {
                _GLFWmapelement* e = fields[i].element;
                int8_t minimum = -1;
                int8_t maximum = 1;

                if (*c == '+')
                {
                    minimum = 0;
                    c += 1;
                }
                else if (*c == '-')
                {
                    maximum = 0;
                    c += 1;
                }

                if (*c == 'a')
                    e->type = _GLFW_JOYSTICK_AXIS;
                else if (*c == 'b')
                    e->type = _GLFW_JOYSTICK_BUTTON;
                else if (*c == 'h')
                    e->type = _GLFW_JOYSTICK_HATBIT;
                else
                    break;

                if (e->type == _GLFW_JOYSTICK_HATBIT)
                {
                    const unsigned long hat = strtoul(c + 1, (char**) &c, 10);
                    const unsigned long bit = strtoul(c + 1, (char**) &c, 10);
                    e->index = (uint8_t) ((hat << 4) | bit);
                }
                else
                    e->index = (uint8_t) strtoul(c + 1, (char**) &c, 10);

                if (e->type == _GLFW_JOYSTICK_AXIS)
                {
                    e->axisScale = 2 / (maximum - minimum);
                    e->axisOffset = -(maximum + minimum);

                    if (*c == '~')
                    {
                        e->axisScale = -e->axisScale;
                        e->axisOffset = -e->axisOffset;
                    }
                }
            }
            else
            {
                length = strlen(_GLFW_PLATFORM_MAPPING_NAME);
                if (strncmp(c, _GLFW_PLATFORM_MAPPING_NAME, length) != 0)
                    return GLFW_FALSE;
            }

            break;
        }

        c += strcspn(c, ",");
        c += strspn(c, ",");
    }

    for (i = 0;  i < 32;  i++)
    {
        if (mapping->guid[i] >= 'A' && mapping->guid[i] <= 'F')
            mapping->guid[i] += 'a' - 'A';
    }

    _glfwPlatformUpdateGamepadGUID(mapping->guid);
    return GLFW_TRUE;
}